

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_prfl(Parser *this,substr buf,flag_t flags)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  char *len_;
  char *pcVar5;
  csubstr cVar6;
  basic_substring<char> local_50;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  len_ = buf.str;
  uVar4 = (uint)buf.len;
  if (((undefined1  [16])buf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pcVar5 = (char *)0x0;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    pcVar5 = (char *)0x4;
    if ((char *)0x3 < len_) {
      (this->m_options).flags = 0x504f5452;
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = (char *)((ulong)pcVar5 | 1), pcVar3 < len_)) {
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RUNK",4);
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RMAP",4);
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x8) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RSEQ",4);
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x10) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"FLOW",4);
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x20) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"QMRK",4);
    }
  }
  if (((undefined1  [16])buf & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RKEY",4);
    }
  }
  if ((char)buf.len < '\0') {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RVAL",4);
    }
  }
  if ((uVar4 >> 8 & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RNXT",4);
    }
  }
  if ((uVar4 >> 9 & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"SSCL",4);
    }
  }
  if ((uVar4 >> 10 & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"QSCL",4);
    }
  }
  if ((uVar4 >> 0xb & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RSET",4);
    }
  }
  if ((uVar4 >> 0xc & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 4;
    bVar2 = true;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"NDOC",4);
    }
  }
  if ((uVar4 >> 0xd & 1) != 0) {
    pcVar3 = pcVar5;
    if ((bVar2) && (pcVar3 = pcVar5 + 1, pcVar3 < len_)) {
      if (len_ <= pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          cVar6 = (csubstr)(*pcVar1)();
          return cVar6;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      pcVar5[(long)(&this->m_stack + -1) + 0x980] = '|';
    }
    pcVar5 = pcVar3 + 8;
    if (pcVar5 <= len_) {
      builtin_strncpy(pcVar3 + (long)(&this->m_stack + -1) + 0x980,"RSEQIMAP",8);
    }
  }
  if (len_ < pcVar5) {
    if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      pcVar1 = (code *)swi(3);
      cVar6 = (csubstr)(*pcVar1)();
      return cVar6;
    }
    local_50.str._0_4_ = 0;
    local_50.str._4_4_ = 0;
    local_50.len._0_4_ = 0x7f56;
    local_50.len._4_4_ = 0;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: pos <= buf.len",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  if (pcVar5 == (char *)0xffffffffffffffff || pcVar5 <= len_) {
    if (pcVar5 != (char *)0xffffffffffffffff) {
      len_ = pcVar5;
    }
    basic_substring<char>::basic_substring(&local_50,(char *)this,(size_t)len_);
    cVar6.str._4_4_ = local_50.str._4_4_;
    cVar6.str._0_4_ = local_50.str._0_4_;
    cVar6.len._0_4_ = (undefined4)local_50.len;
    cVar6.len._4_4_ = local_50.len._4_4_;
    return cVar6;
  }
  if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    pcVar1 = (code *)swi(3);
    cVar6 = (csubstr)(*pcVar1)();
    return cVar6;
  }
  handle_error(0x1fc017,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos");
}

Assistant:

csubstr Parser::_prfl(substr buf, flag_t flags)
{
    size_t pos = 0;
    bool gotone = false;

    #define _prflag(fl)                                     \
    if((flags & fl) == (fl))                                \
    {                                                       \
        if(gotone)                                          \
        {                                                   \
            if(pos + 1 < buf.len)                           \
                buf[pos] = '|';                             \
            ++pos;                                          \
        }                                                   \
        csubstr fltxt = #fl;                                \
        if(pos + fltxt.len <= buf.len)                      \
            memcpy(buf.str + pos, fltxt.str, fltxt.len);    \
        pos += fltxt.len;                                   \
        gotone = true;                                      \
    }

    _prflag(RTOP);
    _prflag(RUNK);
    _prflag(RMAP);
    _prflag(RSEQ);
    _prflag(FLOW);
    _prflag(QMRK);
    _prflag(RKEY);
    _prflag(RVAL);
    _prflag(RNXT);
    _prflag(SSCL);
    _prflag(QSCL);
    _prflag(RSET);
    _prflag(NDOC);
    _prflag(RSEQIMAP);

    #undef _prflag

    RYML_ASSERT(pos <= buf.len);

    return buf.first(pos);
}